

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

char * gl4cts::anon_unknown_0::GetInputM2
                 (vector<float,_std::allocator<float>_> *in,
                 vector<float,_std::allocator<float>_> *expected)

{
  pointer pfVar1;
  
  std::vector<float,_std::allocator<float>_>::resize(in,0x10);
  std::vector<float,_std::allocator<float>_>::resize(expected,4);
  pfVar1 = (in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar1[0] = 1.0;
  pfVar1[1] = 2.0;
  pfVar1[2] = 3.0;
  pfVar1[3] = 4.0;
  pfVar1[4] = 5.0;
  pfVar1[5] = 6.0;
  pfVar1[8] = 1.0;
  pfVar1[9] = 2.0;
  pfVar1[0xc] = 4.0;
  pfVar1[0xd] = 5.0;
  pfVar1[10] = 3.0;
  pfVar1[0xe] = 6.0;
  pfVar1 = (expected->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1[0] = 22.0;
  pfVar1[1] = 28.0;
  pfVar1[2] = 49.0;
  pfVar1[3] = 64.0;
  return (char *)pfVar1;
}

Assistant:

const char* GetInputM2(std::vector<float>& in, std::vector<float>& expected)
{
	in.resize(16);
	expected.resize(4);
	// mat3x2
	in[0] = 1.0f;
	in[2] = 3.0f;
	in[4] = 5.0f;
	in[1] = 2.0f;
	in[3] = 4.0f;
	in[5] = 6.0f;
	// mat2x3
	in[8]  = 1.0f;
	in[12] = 4.0f;
	in[9]  = 2.0f;
	in[13] = 5.0f;
	in[10] = 3.0f;
	in[14] = 6.0f;
	// mat2
	expected[0] = 22.0f;
	expected[2] = 49.0f;
	expected[1] = 28.0f;
	expected[3] = 64.0f;

	return NL "layout(std430, binding = 0) buffer Input {" NL "  layout(column_major) mat3x2 m0;" NL
			  "  layout(column_major) mat2x3 m1;" NL "} g_input;" NL "layout(std430, binding = 1) buffer Output {" NL
			  "  layout(column_major) mat2 m;" NL "} g_output;" NL
			  "void main() { g_output.m = g_input.m0 * g_input.m1; }";
}